

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSHcode Curl_share_unlock(Curl_easy *data,curl_lock_data type)

{
  Curl_share *pCVar1;
  Curl_share *share;
  curl_lock_data type_local;
  Curl_easy *data_local;
  
  pCVar1 = data->share;
  if (pCVar1 == (Curl_share *)0x0) {
    data_local._4_4_ = CURLSHE_INVALID;
  }
  else {
    if (((pCVar1->specifier & 1 << ((byte)type & 0x1f)) != 0) &&
       (pCVar1->unlockfunc != (curl_unlock_function)0x0)) {
      (*pCVar1->unlockfunc)(data,type,pCVar1->clientdata);
    }
    data_local._4_4_ = CURLSHE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLSHcode
Curl_share_unlock(struct Curl_easy *data, curl_lock_data type)
{
  struct Curl_share *share = data->share;

  if(share == NULL)
    return CURLSHE_INVALID;

  if(share->specifier & (1<<type)) {
    if(share->unlockfunc) /* only call this if set! */
      share->unlockfunc (data, type, share->clientdata);
  }

  return CURLSHE_OK;
}